

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O1

SetLogLevelError emulator_set_log_level_from_string(char *s)

{
  int iVar1;
  LogLevel LVar2;
  SetLogLevelError SVar3;
  char *pcVar4;
  size_t __n;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  char *__s;
  bool bVar8;
  
  pcVar4 = strchr(s,0x3d);
  if (pcVar4 == (char *)0x0) {
    SVar3 = SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }
  else {
    uVar6 = 6;
    puVar7 = &DAT_00126c48;
    uVar5 = 0;
    do {
      __s = "<unknown log system>";
      if (uVar5 < 6) {
        __s = (char *)*puVar7;
      }
      __n = strlen(__s);
      iVar1 = strncmp(s,__s,__n);
      if (iVar1 == 0) {
        uVar6 = (ulong)uVar5;
        break;
      }
      puVar7 = puVar7 + 1;
      bVar8 = uVar5 != 5;
      uVar5 = uVar5 + 1;
    } while (bVar8);
    SVar3 = SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
    if ((uint)uVar6 != 6) {
      if (5 < (uint)uVar6) {
        __assert_fail("system < NUM_LOG_SYSTEMS",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                      ,0x2a5,"void emulator_set_log_level(LogSystem, LogLevel)");
      }
      LVar2 = atoi(pcVar4 + 1);
      s_log_level[uVar6] = LVar2;
      SVar3 = SET_LOG_LEVEL_ERROR_NONE;
    }
  }
  return SVar3;
}

Assistant:

SetLogLevelError emulator_set_log_level_from_string(const char* s) {
  const char* log_system_name = s;
  const char* equals = strchr(s, '=');
  if (!equals) {
    return SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }

  LogSystem system = NUM_LOG_SYSTEMS;
  int i;
  for (i = 0; i < NUM_LOG_SYSTEMS; ++i) {
    const char* name = emulator_get_log_system_name(i);
    if (strncmp(log_system_name, name, strlen(name)) == 0) {
      system = i;
      break;
    }
  }

  if (system == NUM_LOG_SYSTEMS) {
    return SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
  }

  emulator_set_log_level(system, atoi(equals + 1));
  return SET_LOG_LEVEL_ERROR_NONE;
}